

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::push_back_grow
          (xpath_node_set_raw *this,xpath_node *node,xpath_allocator *alloc)

{
  xpath_node *pxVar1;
  ulong uVar2;
  long lVar3;
  xpath_node *data;
  size_t new_capacity;
  size_t capacity;
  xpath_allocator *alloc_local;
  xpath_node *node_local;
  xpath_node_set_raw *this_local;
  
  uVar2 = (long)this->_eos - (long)this->_begin >> 4;
  lVar3 = uVar2 + (uVar2 >> 1) + 1;
  pxVar1 = (xpath_node *)xpath_allocator::reallocate(alloc,this->_begin,uVar2 << 4,lVar3 * 0x10);
  if (pxVar1 != (xpath_node *)0x0) {
    this->_begin = pxVar1;
    this->_end = pxVar1 + uVar2;
    this->_eos = pxVar1 + lVar3;
    pxVar1 = this->_end;
    this->_end = pxVar1 + 1;
    (pxVar1->_node)._root = (node->_node)._root;
    (pxVar1->_attribute)._attr = (node->_attribute)._attr;
  }
  return;
}

Assistant:

PUGI__FN_NO_INLINE void xpath_node_set_raw::push_back_grow(const xpath_node& node, xpath_allocator* alloc)
	{
		size_t capacity = static_cast<size_t>(_eos - _begin);

		// get new capacity (1.5x rule)
		size_t new_capacity = capacity + capacity / 2 + 1;

		// reallocate the old array or allocate a new one
		xpath_node* data = static_cast<xpath_node*>(alloc->reallocate(_begin, capacity * sizeof(xpath_node), new_capacity * sizeof(xpath_node)));
		if (!data) return;

		// finalize
		_begin = data;
		_end = data + capacity;
		_eos = data + new_capacity;

		// push
		*_end++ = node;
	}